

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop.cpp
# Opt level: O0

int ncnn::binary_op_no_broadcast<ncnn::binary_op_min>(Mat *a,Mat *b,Mat *c,Option *opt)

{
  long *in_RDX;
  long *in_RSI;
  float *x;
  long *in_RDI;
  float fVar1;
  int i;
  float *outptr;
  float *ptr1;
  float *ptr;
  int q;
  int size;
  int channels;
  binary_op_min op;
  Mat *m_1;
  Mat *m;
  Mat *m_2;
  binary_op_min *this;
  int local_31c;
  undefined8 local_318;
  undefined8 local_310;
  undefined8 local_308;
  undefined4 local_300;
  long local_2f8;
  undefined4 local_2f0;
  undefined4 local_2ec;
  undefined4 local_2e8;
  undefined4 local_2e4;
  undefined4 local_2e0;
  undefined8 local_2d8;
  float *local_2d0;
  undefined8 local_2c8;
  undefined8 local_2c0;
  undefined8 local_2b8;
  undefined4 local_2b0;
  long local_2a8;
  undefined4 local_2a0;
  undefined4 local_29c;
  undefined4 local_298;
  undefined4 local_294;
  undefined4 local_290;
  undefined8 local_288;
  long local_280;
  undefined8 local_278;
  undefined8 local_270;
  undefined8 local_268;
  undefined4 local_260;
  long local_258;
  undefined4 local_250;
  undefined4 local_24c;
  undefined4 local_248;
  undefined4 local_244;
  undefined4 local_240;
  undefined8 local_238;
  long local_230;
  int local_228;
  int local_224;
  int local_220;
  long *local_210;
  long *local_208;
  long *local_200;
  undefined1 local_1f5;
  int local_1f4;
  undefined8 *local_1e8;
  undefined1 local_1dd;
  int local_1dc;
  undefined8 *local_1d0;
  undefined8 *local_1c8;
  undefined8 *local_1c0;
  undefined8 *local_1a8;
  undefined8 *local_1a0;
  binary_op_min *local_198;
  undefined1 local_18d;
  int local_18c;
  undefined8 *local_180;
  undefined8 *local_170;
  long local_168;
  undefined4 local_15c;
  long local_158;
  float *local_150;
  undefined4 local_144;
  int local_140;
  int local_13c;
  undefined8 *local_138;
  long local_130;
  undefined4 local_124;
  long local_120;
  long local_118;
  undefined4 local_10c;
  int local_108;
  int local_104;
  undefined8 *local_100;
  long local_f8;
  undefined4 local_ec;
  long local_e8;
  long local_e0;
  undefined4 local_d4;
  int local_d0;
  int local_cc;
  undefined8 *local_c8;
  undefined4 local_bc;
  long local_b8;
  undefined4 local_ac;
  long local_a8;
  undefined4 local_9c;
  long local_98;
  binary_op_min *local_78;
  undefined8 *local_68;
  undefined8 *local_58;
  
  local_220 = (int)in_RDI[7];
  local_224 = *(int *)((long)in_RDI + 0x2c) * (int)in_RDI[6] * *(int *)((long)in_RDI + 0x34);
  local_210 = in_RDX;
  local_208 = in_RSI;
  local_200 = in_RDI;
  for (local_228 = 0; local_228 < local_220; local_228 = local_228 + 1) {
    local_1d0 = &local_278;
    local_104 = *(int *)((long)local_200 + 0x2c);
    local_108 = (int)local_200[6];
    local_10c = *(undefined4 *)((long)local_200 + 0x34);
    local_230 = *local_200 + local_200[8] * (long)local_228 * local_200[2];
    local_120 = local_200[2];
    local_124 = (undefined4)local_200[3];
    local_130 = local_200[4];
    local_100 = &local_278;
    local_a8 = (long)local_104 * (long)local_108 * local_120;
    local_1c0 = &local_278;
    local_1a8 = &local_278;
    local_1e8 = &local_2c8;
    local_cc = *(int *)((long)local_208 + 0x2c);
    local_d0 = (int)local_208[6];
    local_d4 = *(undefined4 *)((long)local_208 + 0x34);
    local_280 = *local_208 + local_208[8] * (long)local_228 * local_208[2];
    local_e8 = local_208[2];
    local_ec = (undefined4)local_208[3];
    local_f8 = local_208[4];
    local_c8 = &local_2c8;
    local_b8 = (long)local_cc * (long)local_d0 * local_e8;
    local_1c8 = &local_2c8;
    local_1a0 = &local_2c8;
    local_180 = &local_318;
    local_13c = *(int *)((long)local_210 + 0x2c);
    local_140 = (int)local_210[6];
    local_144 = *(undefined4 *)((long)local_210 + 0x34);
    x = (float *)(*local_210 + local_210[8] * (long)local_228 * local_210[2]);
    local_158 = local_210[2];
    local_15c = (undefined4)local_210[3];
    local_168 = local_210[4];
    local_138 = &local_318;
    local_98 = (long)local_13c * (long)local_140 * local_158;
    local_170 = &local_318;
    this = (binary_op_min *)&local_318;
    local_240 = 0;
    local_244 = 0;
    local_248 = 0;
    local_24c = 0;
    local_260 = 0;
    local_268 = 0;
    local_270 = 0;
    local_278 = 0;
    local_290 = 0;
    local_294 = 0;
    local_298 = 0;
    local_29c = 0;
    local_2b0 = 0;
    local_2b8 = 0;
    local_2c0 = 0;
    local_2c8 = 0;
    local_9c = 0x10;
    local_ac = 0x10;
    local_bc = 0x10;
    local_18c = local_228;
    local_18d = 1;
    local_1dc = local_228;
    local_1dd = 1;
    local_1f4 = local_228;
    local_1f5 = 1;
    local_238 = 0;
    local_250 = 0;
    local_288 = 0;
    local_2a0 = 0;
    local_318 = 0;
    local_308 = 0;
    local_300 = 0;
    local_2f0 = 0;
    local_2ec = 0;
    local_2e8 = 0;
    local_2e4 = 0;
    local_2e0 = 0;
    local_2d8 = 0;
    local_310 = 0;
    local_2d0 = x;
    local_198 = this;
    local_150 = x;
    local_118 = local_230;
    local_e0 = local_280;
    local_78 = this;
    local_68 = local_1a0;
    local_58 = local_1a8;
    local_2f8 = local_168;
    local_2a8 = local_f8;
    local_258 = local_130;
    for (local_31c = 0; local_31c < local_224; local_31c = local_31c + 1) {
      fVar1 = binary_op_min::operator()(this,x,(float *)0xfff29f);
      local_2d0[local_31c] = fVar1;
    }
  }
  return 0;
}

Assistant:

static int binary_op_no_broadcast(const Mat& a, const Mat& b, Mat& c, const Option& opt)
{
    Op op;

    int channels = a.c;
    int size = a.w * a.h * a.d;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = a.channel(q);
        const float* ptr1 = b.channel(q);
        float* outptr = c.channel(q);

        for (int i = 0; i < size; i++)
        {
            outptr[i] = op(ptr[i], ptr1[i]);
        }
    }

    return 0;
}